

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void do_disengage(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA *in_RSI;
  CHAR_DATA *in_RDI;
  CHAR_DATA *unaff_retaddr;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  int npulse;
  
  if (in_RDI->fighting == (CHAR_DATA *)0x0) {
    send_to_char((char *)unaff_retaddr,in_RDI);
  }
  else if (in_RDI->fighting->fighting == in_RDI) {
    send_to_char((char *)unaff_retaddr,in_RDI);
  }
  else {
    act((char *)unaff_retaddr,in_RDI,in_RSI,
        (void *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8),0);
    act((char *)unaff_retaddr,in_RDI,in_RSI,
        (void *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8),0);
    act((char *)unaff_retaddr,in_RDI,in_RSI,
        (void *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8),0);
    npulse = (int)((ulong)in_RDI >> 0x20);
    stop_fighting(in_RSI,(bool)in_stack_ffffffffffffffef);
    WAIT_STATE(unaff_retaddr,npulse);
  }
  return;
}

Assistant:

void do_disengage(CHAR_DATA *ch, char *argument)
{
	if (!ch->fighting)
	{
		send_to_char("You aren't fighting anyone!\n\r", ch);
		return;
	}

	if (ch->fighting->fighting == ch)
	{
		send_to_char("It's called fleeing.  Look into it.\n\r", ch);
		return;
	}

	act("You cease attacking $N.", ch, 0, ch->fighting, TO_CHAR);
	act("$n ceases attacking you.", ch, 0, ch->fighting, TO_VICT);
	act("$n ceases attacking $N.", ch, 0, ch->fighting, TO_NOTVICT);

	stop_fighting(ch, false);

	WAIT_STATE(ch, PULSE_VIOLENCE);
}